

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall moira::Moira::dump32(Moira *this,char *str,u32 value)

{
  char *pcVar1;
  StrWriter *pSVar2;
  StrWriter local_48;
  
  pSVar2 = &local_48;
  local_48.style = &this->dataStyle;
  local_48.tab.raw = 8;
  local_48.comment[0] = '\0';
  local_48.base = str;
  local_48.ptr = str;
  StrWriter::operator<<(&local_48,(UInt32)value);
  pcVar1 = local_48.ptr;
  while (local_48.comment[0] != '\0') {
    pSVar2 = (StrWriter *)((long)pSVar2 + 1);
    local_48.ptr = pcVar1 + 1;
    *pcVar1 = local_48.comment[0];
    pcVar1 = local_48.ptr;
    local_48.comment[0] = *(char *)pSVar2;
  }
  *pcVar1 = '\0';
  return;
}

Assistant:

void
Moira::dump32(char *str, u32 value) const
{
    StrWriter(str, dataStyle) << UInt32{value} << Finish{};
}